

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O2

void __thiscall
cfgfile::
tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
::on_start(tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
           *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::
  make_shared<cfgfile::tag_scalar_t<std::__cxx11::string,cfgfile::string_trait_t>,std::__cxx11::string_const&,bool>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffd8,(bool *)&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
  std::
  __shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->m_current).
               super___shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
                *)&stack0xffffffffffffffd8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  peVar1 = (this->m_current).
           super___shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (peVar1->super_tag_t<cfgfile::string_trait_t>).m_parent =
       (this->super_tag_t<cfgfile::string_trait_t>).m_parent;
  (*(peVar1->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[4])(peVar1,info);
  return;
}

Assistant:

void on_start( const parser_info_t< Trait > & info ) override
	{
		m_current = std::make_shared< T > ( this->name(), this->is_mandatory() );
		m_current->set_parent( this->parent() );
		m_current->on_start( info );
	}